

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinformation.cpp
# Opt level: O3

QNetworkInformation * __thiscall
QNetworkInformationPrivate::create(QNetworkInformationPrivate *this,QStringView name)

{
  __pointer_type pQVar1;
  QNetworkInformationBackendFactory *pQVar2;
  bool bVar3;
  Type *pTVar4;
  Type *pTVar5;
  QNetworkInformationBackend *backend;
  QNetworkInformation *this_00;
  QNetworkInformationBackendFactory **ppQVar6;
  long lVar7;
  const_iterator __it;
  long lVar8;
  QNetworkInformation *pQVar9;
  const_iterator __it_00;
  long in_FS_OFFSET;
  QNetworkInformationPrivate *local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this != (QNetworkInformationPrivate *)0x0) &&
     (-2 < (char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>::guard._q_value.
                 super___atomic_base<signed_char>._M_i)) {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::instance();
    bVar3 = initializeList();
    if (bVar3) {
      pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
               instance();
      if ((pTVar4->instanceMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0)
      {
        LOCK();
        bVar3 = (pTVar4->instanceMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p ==
                (__pointer_type)0x0;
        if (bVar3) {
          (pTVar4->instanceMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
        }
        UNLOCK();
        if (!bVar3) goto LAB_001b49ea;
      }
      else {
LAB_001b49ea:
        QBasicMutex::lockInternal();
      }
      pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
               instance();
      pQVar9 = (pTVar5->instanceHolder)._M_t.
               super___uniq_ptr_impl<QNetworkInformation,_QNetworkInformationDeleter>._M_t.
               super__Tuple_impl<0UL,_QNetworkInformation_*,_QNetworkInformationDeleter>.
               super__Head_base<0UL,_QNetworkInformation_*,_false>._M_head_impl;
      pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
               instance();
      if (pQVar9 == (QNetworkInformation *)0x0) {
        __it_00.i = (pTVar5->factories).d.ptr;
        pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
                 instance();
        ppQVar6 = (pTVar5->factories).d.ptr + (pTVar5->factories).d.size;
        lVar8 = (long)ppQVar6 - (long)__it_00.i;
        local_48 = this;
        local_40 = name.m_size;
        if (0 < lVar8 >> 5) {
          lVar7 = (lVar8 >> 5) + 1;
          do {
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>::operator()
                              ((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0> *)
                               &local_48,__it_00);
            __it.i = __it_00.i;
            if (bVar3) goto LAB_001b4b57;
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>::operator()
                              ((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0> *)
                               &local_48,(const_iterator)(__it_00.i + 1));
            __it.i = __it_00.i + 1;
            if (bVar3) goto LAB_001b4b57;
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>::operator()
                              ((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0> *)
                               &local_48,(const_iterator)(__it_00.i + 2));
            __it.i = __it_00.i + 2;
            if (bVar3) goto LAB_001b4b57;
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>::operator()
                              ((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0> *)
                               &local_48,(const_iterator)(__it_00.i + 3));
            __it.i = __it_00.i + 3;
            if (bVar3) goto LAB_001b4b57;
            __it_00.i = __it_00.i + 4;
            lVar7 = lVar7 + -1;
            lVar8 = lVar8 + -0x20;
          } while (1 < lVar7);
        }
        lVar8 = lVar8 >> 3;
        if (lVar8 == 1) {
LAB_001b4b41:
          bVar3 = __gnu_cxx::__ops::_Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>
                  ::operator()((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0> *)
                               &local_48,__it_00);
          __it.i = ppQVar6;
          if (bVar3) {
            __it.i = __it_00.i;
          }
        }
        else {
          __it.i = __it_00.i;
          if (lVar8 == 2) {
LAB_001b4b16:
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>::operator()
                              ((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0> *)
                               &local_48,__it);
            if (!bVar3) {
              __it_00.i = __it.i + 1;
              goto LAB_001b4b41;
            }
          }
          else {
            __it.i = ppQVar6;
            if ((lVar8 == 3) &&
               (bVar3 = __gnu_cxx::__ops::
                        _Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>::operator()
                                  ((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0>
                                    *)&local_48,__it_00), __it.i = __it_00.i, !bVar3)) {
              __it.i = __it_00.i + 1;
              goto LAB_001b4b16;
            }
          }
        }
LAB_001b4b57:
        pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
                 instance();
        if (__it.i != (pTVar5->factories).d.ptr + (pTVar5->factories).d.size) {
          pQVar2 = *__it.i;
          (**(code **)(*(long *)pQVar2 + 0x70))(pQVar2);
          backend = (QNetworkInformationBackend *)(**(code **)(*(long *)pQVar2 + 0x68))(pQVar2);
          if (backend != (QNetworkInformationBackend *)0x0) {
            pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>
                     ::instance();
            this_00 = (QNetworkInformation *)operator_new(0x10);
            QNetworkInformation::QNetworkInformation(this_00,backend);
            pQVar9 = (pTVar5->instanceHolder)._M_t.
                     super___uniq_ptr_impl<QNetworkInformation,_QNetworkInformationDeleter>._M_t.
                     super__Tuple_impl<0UL,_QNetworkInformation_*,_QNetworkInformationDeleter>.
                     super__Head_base<0UL,_QNetworkInformation_*,_false>._M_head_impl;
            (pTVar5->instanceHolder)._M_t.
            super___uniq_ptr_impl<QNetworkInformation,_QNetworkInformationDeleter>._M_t.
            super__Tuple_impl<0UL,_QNetworkInformation_*,_QNetworkInformationDeleter>.
            super__Head_base<0UL,_QNetworkInformation_*,_false>._M_head_impl =
                 (QNetworkInformation *)this_00;
            if (pQVar9 != (QNetworkInformation *)0x0) {
              (**(code **)(*(long *)pQVar9 + 0x20))();
            }
            pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>
                     ::instance();
            goto LAB_001b4a05;
          }
        }
        pQVar9 = (QNetworkInformation *)0x0;
      }
      else {
LAB_001b4a05:
        pQVar9 = (pTVar5->instanceHolder)._M_t.
                 super___uniq_ptr_impl<QNetworkInformation,_QNetworkInformationDeleter>._M_t.
                 super__Tuple_impl<0UL,_QNetworkInformation_*,_QNetworkInformationDeleter>.
                 super__Head_base<0UL,_QNetworkInformation_*,_false>._M_head_impl;
      }
      LOCK();
      pQVar1 = (pTVar4->instanceMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
      (pTVar4->instanceMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if (pQVar1 != (__pointer_type)0x1) {
        QBasicMutex::unlockInternalFutex(pTVar4);
      }
      goto LAB_001b4a11;
    }
  }
  pQVar9 = (QNetworkInformation *)0x0;
LAB_001b4a11:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar9;
}

Assistant:

QNetworkInformation *QNetworkInformationPrivate::create(QStringView name)
{
    if (name.isEmpty())
        return nullptr;
    if (!dataHolder())
        return nullptr;
#ifdef DEBUG_LOADING
    qDebug().nospace() << "create() called with name=\"" << name
                       << "\". instanceHolder initialized? " << !!dataHolder->instanceHolder;
#endif
    if (!initializeList()) {
#ifdef DEBUG_LOADING
        qDebug("Failed to initialize list, returning.");
#endif
        return nullptr;
    }

    QMutexLocker locker(&dataHolder->instanceMutex);
    if (dataHolder->instanceHolder)
        return dataHolder->instanceHolder.get();


    const auto nameMatches = [name](QNetworkInformationBackendFactory *factory) {
        return factory->name().compare(name, Qt::CaseInsensitive) == 0;
    };
    auto it = std::find_if(dataHolder->factories.cbegin(), dataHolder->factories.cend(),
                            nameMatches);
    if (it == dataHolder->factories.cend()) {
#ifdef DEBUG_LOADING
        if (dataHolder->factories.isEmpty()) {
            qDebug("No plugins available");
        } else {
            QString listNames;
            listNames.reserve(8 * dataHolder->factories.count());
            for (const auto *factory : std::as_const(dataHolder->factories))
                listNames += factory->name() + ", "_L1;
            listNames.chop(2);
            qDebug().nospace() << "Couldn't find " << name << " in list with names: { "
                                << listNames << " }";
        }
#endif
        return nullptr;
    }
#ifdef DEBUG_LOADING
    qDebug() << "Creating instance using loader named " << (*it)->name();
#endif
    QNetworkInformationBackend *backend = (*it)->create((*it)->featuresSupported());
    if (!backend)
        return nullptr;
    dataHolder->instanceHolder.reset(new QNetworkInformation(backend));
    Q_ASSERT(name.isEmpty()
             || dataHolder->instanceHolder->backendName().compare(name, Qt::CaseInsensitive) == 0);
    return dataHolder->instanceHolder.get();
}